

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix2.c
# Opt level: O3

char * test_matrix2_columnrowcolumn(void)

{
  int iVar1;
  char *pcVar2;
  matrix2 m;
  matrix2 r;
  matrix2 c;
  matrix2 mStack_48;
  matrix2 local_38;
  matrix2 local_28;
  
  matrix2_zero(&local_28);
  matrix2_zero(&local_38);
  matrix2_zero(&mStack_48);
  _matrix2_set_random(&mStack_48);
  matrix2_set(&local_28,&mStack_48);
  matrix2_set(&local_38,&mStack_48);
  iVar1 = matrix2_equals(&local_28,&local_38);
  if (iVar1 == 0) {
    pcVar2 = 
    "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(167) : (assertion failed) ((matrix2_equals(&c, &r)))"
    ;
  }
  else {
    iVar1 = matrix2_equals(&local_28,&mStack_48);
    if (iVar1 == 0) {
      pcVar2 = 
      "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(168) : (assertion failed) ((matrix2_equals(&c, &m)))"
      ;
    }
    else {
      iVar1 = matrix2_equals(&mStack_48,&local_38);
      if (iVar1 == 0) {
        pcVar2 = 
        "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(169) : (assertion failed) ((matrix2_equals(&m, &r)))"
        ;
      }
      else {
        _matrix2_transpose_rowcolumn(&local_38);
        _matrix2_transpose_columnrow(&local_28);
        iVar1 = matrix2_equals(&local_28,&local_38);
        if (iVar1 == 0) {
          pcVar2 = 
          "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(175) : (assertion failed) ((matrix2_equals(&c, &r)))"
          ;
        }
        else {
          iVar1 = matrix2_equals(&local_28,&mStack_48);
          if (iVar1 == 0) {
            iVar1 = matrix2_equals(&mStack_48,&local_38);
            if (iVar1 == 0) {
              matrix2_transpose(&mStack_48);
              iVar1 = matrix2_equals(&local_28,&mStack_48);
              if (iVar1 == 0) {
                pcVar2 = 
                "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(181) : (assertion failed) ((matrix2_equals(&c, &m)))"
                ;
              }
              else {
                iVar1 = matrix2_equals(&mStack_48,&local_38);
                pcVar2 = (char *)0x0;
                if (iVar1 == 0) {
                  pcVar2 = 
                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(182) : (assertion failed) ((matrix2_equals(&m, &r)))"
                  ;
                }
              }
            }
            else {
              pcVar2 = 
              "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(177) : (assertion failed) ((matrix2_equals(&m, &r) == 0))"
              ;
            }
          }
          else {
            pcVar2 = 
            "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(176) : (assertion failed) ((matrix2_equals(&c, &m) == 0))"
            ;
          }
        }
      }
    }
  }
  return pcVar2;
}

Assistant:

static char *test_matrix2_columnrowcolumn(void)
{
	struct matrix2 c;
	struct matrix2 r;
	struct matrix2 m;

	matrix2_zero(&c);
	matrix2_zero(&r);
	matrix2_zero(&m);

	_matrix2_set_random(&m);

	matrix2_set(&c, &m);
	matrix2_set(&r, &m);

	test_assert(matrix2_equals(&c, &r));
	test_assert(matrix2_equals(&c, &m));
	test_assert(matrix2_equals(&m, &r));

	/* transpose only c and r, but not m */
	_matrix2_transpose_rowcolumn(&r);
	_matrix2_transpose_columnrow(&c);

	test_assert(matrix2_equals(&c, &r));
	test_assert(matrix2_equals(&c, &m) == 0);
	test_assert(matrix2_equals(&m, &r) == 0);

	matrix2_transpose(&m);

	test_assert(matrix2_equals(&c, &m));
	test_assert(matrix2_equals(&m, &r));

	return NULL;
}